

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O2

void __thiscall Vault::AppRoleStrategy::~AppRoleStrategy(AppRoleStrategy *this)

{
  (this->super_AuthenticationStrategy)._vptr_AuthenticationStrategy =
       (_func_int **)&PTR__AppRoleStrategy_001c5510;
  std::__cxx11::string::~string((string *)&this->mount_);
  std::__cxx11::string::~string((string *)&this->secretId_);
  std::__cxx11::string::~string((string *)&this->roleId_);
  return;
}

Assistant:

explicit AppRoleStrategy(RoleId roleId, SecretId secretId)
      : roleId_(std::move(roleId)), secretId_(std::move(secretId)),
        mount_(Path{"approle"}) {}